

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_CryptoError.cpp
# Opt level: O0

StringRef * axl::cry::CryptoErrorProvider::getErrorDescription(ulong_t code)

{
  ulong in_RSI;
  StringRef *in_RDI;
  String errorString;
  char *reasonString;
  char *functionString;
  StringRef *this;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> local_40;
  char *local_20;
  char *local_18;
  ulong local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  local_18 = ERR_func_error_string(in_RSI);
  local_20 = ERR_reason_error_string(local_10);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14d357);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format
            (&local_40,"OpenSSL error 0x%x",local_10);
  if (local_18 != (char *)0x0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat
              (&local_40," in %s",local_18);
  }
  if (local_20 != (char *)0x0) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat(&local_40,": %s",local_20)
    ;
  }
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(this,in_RDI);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x14d3ed);
  return this;
}

Assistant:

sl::StringRef
CryptoErrorProvider::getErrorDescription(ulong_t code) {
	const char* functionString = ::ERR_func_error_string(code);
	const char* reasonString = ::ERR_reason_error_string(code);

	sl::String errorString;
	errorString.format("OpenSSL error 0x%x", code);

	if (functionString)
		errorString.appendFormat(" in %s", functionString);

	if (reasonString)
		errorString.appendFormat(": %s", reasonString);

	return errorString;
}